

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.h
# Opt level: O2

void __thiscall MeCab::Connector::Connector(Connector *this)

{
  Mmap<short> *this_00;
  
  this->_vptr_Connector = (_func_int **)&PTR__Connector_0016bd60;
  this_00 = (Mmap<short> *)operator_new(0x1d8);
  Mmap<short>::Mmap(this_00);
  (this->cmmap_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_0016bdc0;
  (this->cmmap_).ptr_ = this_00;
  this->matrix_ = (short *)0x0;
  this->lsize_ = 0;
  this->rsize_ = 0;
  whatlog::whatlog(&this->what_);
  return;
}

Assistant:

explicit Connector():
      cmmap_(new Mmap<short>), matrix_(0), lsize_(0), rsize_(0) {}